

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O3

float Lf_CutRef_rec(Lf_Man_t *p,Lf_Cut_t *pCut)

{
  uint uVar1;
  int iVar2;
  Jf_Par_t *pJVar3;
  int *piVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  word CutTemp [10];
  Lf_Cut_t local_78;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_78.iFunc = 0;
  local_78._20_4_ = 0;
  uStack_60 = 0;
  local_78.Sign = 0;
  local_78.Delay = 0;
  local_78.Flow = 0.0;
  uVar1 = *(uint *)&pCut->field_0x14;
  fVar8 = 0.0;
  if ((uVar1 >> 0x17 & 1) == 0 && 0x1ffffff < uVar1) {
    uVar6 = uVar1 >> 0x18;
    pJVar3 = p->pPars;
    if (pJVar3->fPower == 0) {
      if (pJVar3->fOptEdge == 0) {
        fVar8 = 1.0;
      }
      else {
        fVar8 = (float)(int)(uVar6 + pJVar3->nAreaTuner);
      }
      goto LAB_007108a6;
    }
    fVar8 = 0.0;
    uVar7 = 0;
    do {
      iVar2 = *(int *)((long)&pCut[1].Sign + uVar7 * 4);
      if (((long)iVar2 < 0) || ((p->vSwitches).nSize <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
                      ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
      }
      fVar8 = fVar8 + (p->vSwitches).pArray[iVar2];
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
    fVar8 = (float)uVar6 + fVar8;
  }
  if (uVar1 < 0x1000000) {
    return fVar8;
  }
LAB_007108a6:
  uVar7 = 0;
  do {
    uVar1 = *(uint *)((long)&pCut[1].Sign + uVar7 * 4);
    if ((ulong)uVar1 == 0) {
      return fVar8;
    }
    if (((int)uVar1 < 0) || ((p->vOffsets).nSize <= (int)uVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar2 = (p->vOffsets).pArray[uVar1];
    lVar5 = (long)iVar2;
    if (-1 < lVar5) {
      if ((p->vMapRefs).nSize <= iVar2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar4 = (p->vMapRefs).pArray;
      iVar2 = piVar4[lVar5];
      piVar4[lVar5] = iVar2 + 1;
      if (iVar2 == 0) {
        Lf_ObjCutBestNew(p,uVar1,&local_78);
        fVar9 = Lf_CutRef_rec(p,&local_78);
        fVar8 = fVar8 + fVar9;
      }
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 < (byte)pCut->field_0x17);
  return fVar8;
}

Assistant:

float Lf_CutRef_rec( Lf_Man_t * p, Lf_Cut_t * pCut )
{
    word CutTemp[LF_CUT_WORDS] = {0};
    float Count = Lf_CutArea(p, pCut);
    int i, Var; 
    Lf_CutForEachVar( pCut, Var, i )
        if ( !Lf_ObjMapRefInc(p, Var) )
            Count += Lf_CutRef_rec( p, Lf_ObjCutBestNew(p, Var, (Lf_Cut_t *)CutTemp) );
    return Count;
}